

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::AnnotateEx(double x,double y,bool clamp,ImVec4 *col,ImVec2 *off,char *fmt,
                       __va_list_tag *args)

{
  ImU32 bg_00;
  ImU32 local_60;
  ImU32 fg;
  ImU32 bg;
  ImVec2 pos;
  ImPlotContext *gp;
  __va_list_tag *args_local;
  char *fmt_local;
  ImVec2 *off_local;
  ImVec4 *col_local;
  bool clamp_local;
  double y_local;
  double x_local;
  
  pos = (ImVec2)GImPlot;
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"Annotate() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xae2,
                  "void ImPlot::AnnotateEx(double, double, bool, const ImVec4 &, const ImVec2 &, const char *, __va_list_tag *)"
                 );
  }
  _fg = PlotToPixels(x,y,-1);
  bg_00 = ImGui::GetColorU32(col);
  if ((col->w != 0.0) || (NAN(col->w))) {
    local_60 = CalcTextColor(col);
  }
  else {
    local_60 = GetStyleColorU32(0xc);
  }
  ImPlotAnnotationCollection::AppendV
            ((ImPlotAnnotationCollection *)((long)pos + 0x168),(ImVec2 *)&fg,off,bg_00,local_60,
             clamp,fmt,args);
  return;
}

Assistant:

void AnnotateEx(double x, double y, bool clamp, const ImVec4& col, const ImVec2& off, const char* fmt, va_list args) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "Annotate() needs to be called between BeginPlot() and EndPlot()!");
    ImVec2 pos = PlotToPixels(x,y);
    ImU32  bg  = ImGui::GetColorU32(col);
    ImU32  fg  = col.w == 0 ? GetStyleColorU32(ImPlotCol_InlayText) : CalcTextColor(col);
    gp.Annotations.AppendV(pos, off, bg, fg, clamp, fmt, args);
}